

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Create.c
# Opt level: O2

void tge_destroy(tgestate_t *state)

{
  if (state != (tgestate_t *)0x0) {
    free(state->map_buf);
    free(state->window_buf);
    free(state->tile_buf);
    free(state);
    return;
  }
  return;
}

Assistant:

TGE_API void tge_destroy(tgestate_t *state)
{
  if (state == NULL)
    return;

  free(state->map_buf);
  free(state->window_buf);
  free(state->tile_buf);

  free(state);
}